

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identification_strategy.cpp
# Opt level: O0

LCC_EVENT_TYPE __thiscall
license::hw_identifier::IdentificationStrategy::validate_identifier
          (IdentificationStrategy *this,HwIdentifier *identifier)

{
  bool bVar1;
  LCC_API_HW_IDENTIFICATION_STRATEGY LVar2;
  LCC_API_HW_IDENTIFICATION_STRATEGY LVar3;
  reference lhs;
  HwIdentifier *it;
  const_iterator __end3;
  const_iterator __begin3;
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  *__range3;
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  available_ids;
  LCC_EVENT_TYPE result;
  HwIdentifier *identifier_local;
  IdentificationStrategy *this_local;
  
  available_ids.
  super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = IDENTIFIERS_MISMATCH;
  LVar2 = HwIdentifier::get_identification_strategy(identifier);
  LVar3 = (*this->_vptr_IdentificationStrategy[2])();
  if (LVar2 == LVar3) {
    (*this->_vptr_IdentificationStrategy[4])(&__range3);
    __end3 = std::
             vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
             ::begin((vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
                      *)&__range3);
    it = (HwIdentifier *)
         std::
         vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
         ::end((vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
                *)&__range3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_license::hw_identifier::HwIdentifier_*,_std::vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>_>
                                       *)&it), bVar1) {
      lhs = __gnu_cxx::
            __normal_iterator<const_license::hw_identifier::HwIdentifier_*,_std::vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>_>
            ::operator*(&__end3);
      bVar1 = hw_identifier::operator==(lhs,identifier);
      if (bVar1) {
        available_ids.
        super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = LICENSE_OK;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_license::hw_identifier::HwIdentifier_*,_std::vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>_>
      ::operator++(&__end3);
    }
    std::
    vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
    ::~vector((vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
               *)&__range3);
  }
  return available_ids.
         super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

LCC_EVENT_TYPE IdentificationStrategy::validate_identifier(const HwIdentifier& identifier) const {
	LCC_EVENT_TYPE result = IDENTIFIERS_MISMATCH;

	if (identifier.get_identification_strategy() == identification_strategy()) {
		const vector<HwIdentifier> available_ids = alternative_ids();
		for (const auto& it : available_ids) {
			if (it == identifier) {
				result = LICENSE_OK;
				break;
			}
		}
	}
	return result;
}